

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPlotIO.cpp
# Opt level: O0

void __thiscall NaDPlotFile::WriteDPlotFile(NaDPlotFile *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  undefined8 uVar9;
  NaVector *pNVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  char **ppcVar11;
  char *pcVar12;
  long *in_RDI;
  int iSer;
  int nRest;
  int nBy5;
  int iVar;
  int in_stack_ffffffffffffff5c;
  NaDynAr<NaVector> *in_stack_ffffffffffffff60;
  FILE *pFVar13;
  int local_18;
  int local_c;
  
  fprintf((FILE *)in_RDI[4],"%s\n","DPLOT/W v1.2");
  pFVar13 = (FILE *)in_RDI[4];
  uVar4 = NaDynAr<NaVector>::count((NaDynAr<NaVector> *)(in_RDI + 6));
  fprintf(pFVar13,"dx\n%u\n",(ulong)uVar4);
  iVar5 = NaDynAr<NaVector>::count((NaDynAr<NaVector> *)(in_RDI + 6));
  if (iVar5 != 0) {
    for (local_c = 0; iVar5 = NaDynAr<NaVector>::count((NaDynAr<NaVector> *)(in_RDI + 6)),
        local_c < iVar5; local_c = local_c + 1) {
      lVar8 = (**(code **)(*in_RDI + 0x38))();
      iVar5 = (int)(lVar8 / 5);
      iVar6 = (**(code **)(*in_RDI + 0x38))();
      iVar6 = iVar6 + iVar5 * -5;
      pFVar13 = (FILE *)in_RDI[4];
      uVar9 = (**(code **)(*in_RDI + 0x38))();
      fprintf(pFVar13,"%lu\n",uVar9);
      for (local_18 = 0; local_18 < iVar5; local_18 = local_18 + 1) {
        pFVar13 = (FILE *)in_RDI[4];
        pNVar10 = NaDynAr<NaVector>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c)
        ;
        iVar7 = (*pNVar10->_vptr_NaVector[8])(pNVar10,(ulong)(uint)(local_18 * 5));
        uVar9 = *(undefined8 *)CONCAT44(extraout_var,iVar7);
        pNVar10 = NaDynAr<NaVector>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c)
        ;
        iVar7 = (*pNVar10->_vptr_NaVector[8])(pNVar10,(ulong)(local_18 * 5 + 1));
        uVar1 = *(undefined8 *)CONCAT44(extraout_var_00,iVar7);
        pNVar10 = NaDynAr<NaVector>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c)
        ;
        iVar7 = (*pNVar10->_vptr_NaVector[8])(pNVar10,(ulong)(local_18 * 5 + 2));
        uVar2 = *(undefined8 *)CONCAT44(extraout_var_01,iVar7);
        pNVar10 = NaDynAr<NaVector>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c)
        ;
        iVar7 = (*pNVar10->_vptr_NaVector[8])(pNVar10,(ulong)(local_18 * 5 + 3));
        uVar3 = *(undefined8 *)CONCAT44(extraout_var_02,iVar7);
        pNVar10 = NaDynAr<NaVector>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c)
        ;
        iVar7 = (*pNVar10->_vptr_NaVector[8])(pNVar10,(ulong)(local_18 * 5 + 4));
        fprintf(pFVar13,"%g,%g,%g,%g,%g\n",uVar9,uVar1,uVar2,uVar3,
                *(undefined8 *)CONCAT44(extraout_var_03,iVar7));
      }
      if (iVar6 != 0) {
        for (local_18 = 0; local_18 < iVar6 + -1; local_18 = local_18 + 1) {
          pFVar13 = (FILE *)in_RDI[4];
          pNVar10 = NaDynAr<NaVector>::operator[]
                              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
          iVar7 = (*pNVar10->_vptr_NaVector[8])(pNVar10,(ulong)(uint)(iVar5 * 5 + local_18));
          fprintf(pFVar13,"%g,",*(undefined8 *)CONCAT44(extraout_var_04,iVar7));
        }
        pFVar13 = (FILE *)in_RDI[4];
        pNVar10 = NaDynAr<NaVector>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c)
        ;
        iVar5 = (*pNVar10->_vptr_NaVector[8])(pNVar10,(ulong)(uint)(iVar5 * 5 + local_18));
        fprintf(pFVar13,"%g\n",*(undefined8 *)CONCAT44(extraout_var_05,iVar5));
      }
      pFVar13 = (FILE *)in_RDI[4];
      lVar8 = (**(code **)(*in_RDI + 0x38))();
      fprintf(pFVar13,"0,%ld\n",lVar8 + -1);
      fputs(" 1    0\n",(FILE *)in_RDI[4]);
      pFVar13 = (FILE *)in_RDI[4];
      ppcVar11 = NaDynAr<char_*>::operator[]
                           ((NaDynAr<char_*> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      fprintf(pFVar13,"%s\n\n",*ppcVar11);
    }
    pFVar13 = (FILE *)in_RDI[4];
    uVar9 = (**(code **)(*in_RDI + 0x58))(in_RDI,0);
    fprintf(pFVar13,"%s\n",uVar9);
    pFVar13 = (FILE *)in_RDI[4];
    uVar9 = (**(code **)(*in_RDI + 0x58))(in_RDI,1);
    fprintf(pFVar13,"%s\n",uVar9);
    fprintf((FILE *)in_RDI[4],"\n\n");
    fprintf((FILE *)in_RDI[4],"     1\n0.0,0.0\nDate\n           1\nGrid Type\n01\n");
    fprintf((FILE *)in_RDI[4],"LineWidths\n");
    for (local_c = 0; iVar5 = NaDynAr<NaVector>::count((NaDynAr<NaVector> *)(in_RDI + 6)),
        local_c < iVar5; local_c = local_c + 1) {
      fprintf((FILE *)in_RDI[4]," 10");
    }
    fprintf((FILE *)in_RDI[4],"\n");
    fprintf((FILE *)in_RDI[4],"PointSizes\n 7\n 10 18 14 14 14 11 10\n");
    fprintf((FILE *)in_RDI[4],"SymbolSizes\n");
    for (local_c = 0; iVar5 = NaDynAr<NaVector>::count((NaDynAr<NaVector> *)(in_RDI + 6)),
        local_c < iVar5; local_c = local_c + 1) {
      if (local_c == 0) {
        fprintf((FILE *)in_RDI[4]," %3d",0x7d);
      }
      else {
        fprintf((FILE *)in_RDI[4]," %3d",0);
      }
    }
    fprintf((FILE *)in_RDI[4],"\n");
    pcVar12 = (char *)(**(code **)(*in_RDI + 0x58))(in_RDI,2);
    if (*pcVar12 != '\0') {
      pFVar13 = (FILE *)in_RDI[4];
      uVar9 = (**(code **)(*in_RDI + 0x58))(in_RDI,2);
      fprintf(pFVar13,"Title3\n%s\n",uVar9);
    }
    fprintf((FILE *)in_RDI[4],"Stop\n");
  }
  return;
}

Assistant:

void
NaDPlotFile::WriteDPlotFile ()
{
    // Magic
    fprintf(fp, "%s\n", NaIO_DPLOT_MAGIC);

    // Data format description, number of series
    fprintf(fp, "dx\n%u\n", aVars.count());

    if(0 == aVars.count()){
        return;
    }

    int iVar;
    for(iVar = 0; iVar < aVars.count(); ++iVar){
        int     nBy5, nRest, iSer;
        nBy5 = CountOfRecord() / 5;
        nRest = CountOfRecord() - 5 * nBy5;

        // Number of values in the series
        fprintf(fp, "%lu\n", CountOfRecord());
        // Values in the series
        for(iSer = 0; iSer < nBy5; ++iSer){
            fprintf(fp, "%g,%g,%g,%g,%g\n", aVars[iVar][5*iSer+0],
                    aVars[iVar][5*iSer+1], aVars[iVar][5*iSer+2],
                    aVars[iVar][5*iSer+3], aVars[iVar][5*iSer+4]);
        }
        if(nRest != 0){
            for(iSer = 0; iSer < nRest - 1; ++iSer){
                fprintf(fp, "%g,", aVars[iVar][5 * nBy5 + iSer]);
            }
            fprintf(fp, "%g\n", aVars[iVar][5 * nBy5 + iSer]);
        }
        // Argument range for the series
        fprintf(fp, "0,%ld\n", CountOfRecord() - 1);
        // Type of curve -- solid line without knots
        fputs(" 1    0\n", fp);
        // Name of the series
        fprintf(fp, "%s\n\n", aVarNames[iVar]);
    }

    // Titles
    fprintf(fp, "%s\n", GetTitle(0));
    fprintf(fp, "%s\n", GetTitle(1));

    fprintf(fp, "\n\n");

    fprintf(fp, "     1\n0.0,0.0\nDate\n           1\nGrid Type\n01\n");

    // For each series
    fprintf(fp, "LineWidths\n");
    for(iVar = 0; iVar < aVars.count(); ++iVar){
        fprintf(fp, " 10");
    }
    fprintf(fp, "\n");

    fprintf(fp, "PointSizes\n 7\n 10 18 14 14 14 11 10\n");

    fprintf(fp, "SymbolSizes\n");
    for(iVar = 0; iVar < aVars.count(); ++iVar){
        if(0 == iVar)
            fprintf(fp, " %3d", 125);
        else
            fprintf(fp, " %3d", 0);
    }
    fprintf(fp, "\n");

    if('\0' != GetTitle(2)[0])
        fprintf(fp, "Title3\n%s\n", GetTitle(2));

    // End of file
    fprintf(fp, "Stop\n");
}